

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

WordType llvm::APInt::tcAddPart(WordType *dst,WordType src,uint parts)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (parts == uVar3) break;
    puVar1 = dst + uVar3;
    bVar4 = CARRY8(*puVar1,src);
    *puVar1 = *puVar1 + src;
    src = 1;
    uVar2 = uVar3 + 1;
  } while (bVar4);
  return (ulong)(parts <= uVar3);
}

Assistant:

APInt::WordType APInt::tcAddPart(WordType *dst, WordType src,
                                 unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    dst[i] += src;
    if (dst[i] >= src)
      return 0; // No need to carry so exit early.
    src = 1; // Carry one to next digit.
  }

  return 1;
}